

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffh2st(fitsfile *fptr,char **header,int *status)

{
  int iVar1;
  LONGLONG *dataend;
  void *pvVar2;
  LONGLONG *in_RDX;
  fitsfile *in_RSI;
  LONGLONG headstart;
  long nrec;
  int *in_stack_00000010;
  int nkeys;
  int *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if ((int)*in_RDX < 1) {
    iVar1 = ffghsp((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int *)0x1d1005);
    if (iVar1 < 1) {
      dataend = (LONGLONG *)(long)(in_stack_ffffffffffffffdc / 0x24 + 1);
      pvVar2 = calloc((long)dataend * 0xb40 + 1,1);
      *(void **)in_RSI = pvVar2;
      if (*(long *)in_RSI == 0) {
        *(undefined4 *)in_RDX = 0x71;
        ffpmsg((char *)0x1d1074);
        local_4 = (int)*in_RDX;
      }
      else {
        ffghadll(in_RSI,in_RDX,
                 (LONGLONG *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),dataend,
                 in_stack_ffffffffffffffc8);
        ffmbyt(in_RSI,(LONGLONG)in_RDX,in_stack_ffffffffffffffdc,(int *)dataend);
        ffgbyt(fptr,(LONGLONG)header,status,in_stack_00000010);
        *(undefined1 *)(*(long *)in_RSI + (long)dataend * 0xb40) = 0;
        local_4 = (int)*in_RDX;
      }
    }
    else {
      local_4 = (int)*in_RDX;
    }
  }
  else {
    local_4 = (int)*in_RDX;
  }
  return local_4;
}

Assistant:

int ffh2st(fitsfile *fptr,   /* I - FITS file pointer           */
           char **header,    /* O - returned header string      */
           int  *status)     /* IO - error status               */

/*
  read header keywords into a long string of chars.  This routine allocates
  memory for the string, so the calling routine must eventually free the
  memory when it is not needed any more.
*/
{
    int nkeys;
    long nrec;
    LONGLONG headstart;

    if (*status > 0)
        return(*status);

    /* get number of keywords in the header (doesn't include END) */
    if (ffghsp(fptr, &nkeys, NULL, status) > 0)
        return(*status);

    nrec = (nkeys / 36 + 1);

    /* allocate memory for all the keywords (multiple of 2880 bytes) */
    *header = (char *) calloc ( nrec * 2880 + 1, 1);
    if (!(*header))
    {
         *status = MEMORY_ALLOCATION;
         ffpmsg("failed to allocate memory to hold all the header keywords");
         return(*status);
    }

    ffghadll(fptr, &headstart, NULL, NULL, status); /* get header address */
    ffmbyt(fptr, headstart, REPORT_EOF, status);   /* move to header */
    ffgbyt(fptr, nrec * 2880, *header, status);     /* copy header */
    *(*header + (nrec * 2880)) = '\0';

    return(*status);
}